

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatMatvecSetup(SUNMatrix A,int myid)

{
  int iVar1;
  uint in_ESI;
  SUNMatrix in_RDI;
  double dVar2;
  double dVar3;
  double stop_time;
  double start_time;
  int failure;
  int local_4;
  
  if (in_RDI->ops->matvecsetup == (_func_SUNErrCode_SUNMatrix *)0x0) {
    if ((print_all_ranks == 0) && (in_ESI == 0)) {
      printf("    PASSED test -- SUNMatMatvecSetup not implemented\n");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_ESI);
      printf("    PASSED test -- SUNMatMatvecSetup not implemented\n");
    }
    local_4 = 0;
  }
  else {
    dVar2 = get_time();
    iVar1 = SUNMatMatvecSetup(in_RDI);
    sync_device(in_RDI);
    dVar3 = get_time();
    if (iVar1 == 0) {
      if ((print_all_ranks == 0) && (in_ESI == 0)) {
        printf("    PASSED test -- SUNMatMatvecSetup\n");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ESI);
        printf("    PASSED test -- SUNMatMatvecSetup\n");
      }
      if ((in_ESI == 0) && (print_time != 0)) {
        printf("    SUNMatMatvecSetup Time: %22.15e \n \n",dVar3 - dVar2);
      }
      local_4 = 0;
    }
    else {
      if ((print_all_ranks == 0) && (in_ESI == 0)) {
        printf(">>> FAILED test -- SUNMatMatvecSetup \n");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ESI);
        printf(">>> FAILED test -- SUNMatMatvecSetup \n");
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int Test_SUNMatMatvecSetup(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;

  if (A->ops->matvecsetup == NULL)
  {
    TEST_STATUS("    PASSED test -- SUNMatMatvecSetup not implemented\n", myid);
    return (0);
  }

  start_time = get_time();
  failure    = SUNMatMatvecSetup(A);
  sync_device(A);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatMatvecSetup \n", myid);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatMatvecSetup\n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatMatvecSetup Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}